

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestCase.cpp
# Opt level: O3

void __thiscall
tcu::TestNode::TestNode
          (TestNode *this,TestContext *testCtx,TestNodeType nodeType,char *name,char *description)

{
  allocator<char> local_1a;
  allocator<char> local_19;
  
  this->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d51938;
  this->m_testCtx = testCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_name,name,&local_19);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_description,description,&local_1a);
  this->m_nodeType = nodeType;
  (this->m_children).super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_children).super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_children).super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

TestNode::TestNode (TestContext& testCtx, TestNodeType nodeType, const char* name, const char* description)
	: m_testCtx		(testCtx)
	, m_name		(name)
	, m_description	(description)
	, m_nodeType	(nodeType)
{
	DE_ASSERT(isValidCaseName(name));
}